

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

error_code llvm::sys::fs::is_symlink_file(Twine *path,bool *result)

{
  bool bVar1;
  error_code eVar2;
  undefined1 local_70 [8];
  file_status st;
  bool *result_local;
  Twine *path_local;
  error_code ec;
  
  st.fs_st_ino = (ino_t)result;
  file_status::file_status((file_status *)local_70);
  eVar2 = status(path,(file_status *)local_70,false);
  ec._0_8_ = eVar2._M_cat;
  path_local._0_4_ = eVar2._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&path_local);
  if (!bVar1) {
    bVar1 = is_symlink_file((basic_file_status *)local_70);
    *(bool *)st.fs_st_ino = bVar1;
    std::error_code::error_code((error_code *)&path_local);
  }
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)path_local;
  eVar2._M_cat = (error_category *)ec._0_8_;
  return eVar2;
}

Assistant:

std::error_code is_symlink_file(const Twine &path, bool &result) {
  file_status st;
  if (std::error_code ec = status(path, st, false))
    return ec;
  result = is_symlink_file(st);
  return std::error_code();
}